

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O0

void starvation_branches(size_t W)

{
  code *pcVar1;
  byte extraout_AL;
  Executor *this;
  char **__stat_loc;
  ulong in_RDI;
  double __x;
  Expression_lhs<const_std::atomic<unsigned_long>_&> EVar2;
  ResultBuilder DOCTEST_RB;
  size_t b_1;
  size_t b;
  size_t l;
  Task curr;
  Task prev;
  atomic<unsigned_long> counter;
  Executor executor;
  Taskflow taskflow;
  Task *in_stack_fffffffffffffc58;
  Result *res;
  Taskflow *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  char *in_stack_fffffffffffffc70;
  ulong uVar3;
  Enum at;
  Taskflow *in_stack_fffffffffffffc80;
  ResultBuilder *this_00;
  char *in_stack_fffffffffffffc90;
  anon_class_16_2_26634884 *in_stack_fffffffffffffca0;
  FlowBuilder *in_stack_fffffffffffffca8;
  unsigned_long *in_stack_fffffffffffffce0;
  Expression_lhs<const_std::atomic<unsigned_long>_&> *in_stack_fffffffffffffce8;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffd48;
  element_type *in_stack_fffffffffffffd50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffd58;
  ulong local_278;
  ulong local_260;
  Task local_250;
  ulong local_248;
  Task local_240;
  Task local_238;
  undefined1 local_230 [24];
  ResultBuilder local_218 [4];
  ulong local_8;
  
  local_8 = in_RDI;
  tf::Taskflow::Taskflow(in_stack_fffffffffffffc80);
  this_00 = local_218;
  uVar3 = local_8;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58)
  ;
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffd58._M_pi,(size_t)in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd48);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x117465);
  memset(local_230,0,8);
  tf::Task::Task(&local_238);
  tf::Task::Task(&local_240);
  for (local_248 = 0; local_248 < 100; local_248 = local_248 + 1) {
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:21:29),_nullptr>
              (in_stack_fffffffffffffca8,(anon_class_8_1_bc7188dc *)in_stack_fffffffffffffca0);
    tf::Task::operator=(&local_240,&local_250);
    if (local_248 != 0) {
      tf::Task::succeed<tf::Task&>((Task *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    }
    tf::Task::operator=(&local_238,&local_240);
  }
  for (local_260 = local_8 >> 1; local_260 < local_8; local_260 = local_260 + 1) {
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:34:22),_nullptr>
              (in_stack_fffffffffffffca8,(anon_class_8_1_bc7188dc *)in_stack_fffffffffffffca0);
    tf::Task::succeed<tf::Task&>((Task *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  }
  for (local_278 = 0; at = (Enum)(uVar3 >> 0x20), local_278 < local_8 >> 1;
      local_278 = local_278 + 1) {
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:40:22),_nullptr>
              (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    tf::Task::succeed<tf::Task&>((Task *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  }
  __stat_loc = &local_218[0].super_AssertData.m_file;
  tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                    in_stack_fffffffffffffc60);
  std::__basic_future<void>::wait((__basic_future<void> *)&stack0xfffffffffffffd50,__stat_loc);
  tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffffc60);
  res = (Result *)0x18308d;
  doctest::detail::ResultBuilder::ResultBuilder
            (this_00,at,in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
             (char *)in_stack_fffffffffffffc60,"",in_stack_fffffffffffffc90);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&stack0xfffffffffffffca4,DT_REQUIRE);
  EVar2 = doctest::detail::ExpressionDecomposer::operator<<<std::atomic<unsigned_long>,_nullptr>
                    ((ExpressionDecomposer *)in_stack_fffffffffffffc60,(atomic<unsigned_long> *)res)
  ;
  this = (Executor *)EVar2.lhs;
  doctest::detail::Expression_lhs<std::atomic<unsigned_long>const&>::operator==
            (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffffc60,res);
  doctest::detail::Result::~Result((Result *)0x1177b1);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffcd8,__x);
  if ((extraout_AL & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffffc60);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1178a1);
    tf::Executor::~Executor(this);
    tf::Taskflow::~Taskflow(in_stack_fffffffffffffc60);
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void starvation_branches(size_t W) {

  tf::Taskflow taskflow;
  tf::Executor executor(W);
  std::atomic<size_t> counter{0};

  tf::Task prev, curr;
  
  // simple linear chain
  for(size_t l=0; l<100; l++) {

    curr = taskflow.emplace([&](){
      counter.fetch_add(1, std::memory_order_relaxed);
    });

    if(l) {
      curr.succeed(prev);
    }

    prev = curr;
  }

  // branches
  for(size_t b=W/2; b<W; b++) {
    taskflow.emplace([&](){
      counter.fetch_add(1, std::memory_order_relaxed);
    }).succeed(curr);
  }

  for(size_t b=0; b<W/2; b++) {
    taskflow.emplace([&](){
      while(counter.load(std::memory_order_relaxed) != W - W/2 + 100){
        std::this_thread::yield();
      }
    }).succeed(curr);
  }

  executor.run(taskflow).wait();

  REQUIRE(counter == W - W/2 + 100);

}